

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  Tokenizer *this_00;
  int iVar1;
  bool bVar2;
  __type _Var3;
  TokenType TVar4;
  string *psVar5;
  AlphaNum *in_R8;
  string text;
  AlphaNum local_b0;
  string local_80;
  AlphaNum local_60;
  
  iVar1 = this->recursion_limit_;
  this->recursion_limit_ = iVar1 + -1;
  if (iVar1 < 1) {
    text._M_dataplus._M_p =
         "Message is too deep, the parser exceeded the configured recursion limit of ";
    text._M_string_length = 0x4b;
    strings::AlphaNum::AlphaNum(&local_b0,this->initial_recursion_limit_);
    local_60.piece_data_ = ".";
    local_60.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_80,(protobuf *)&text,&local_b0,&local_60,in_R8);
    ReportError(this,&local_80);
    psVar5 = &local_80;
LAB_003b0c47:
    std::__cxx11::string::~string((string *)psVar5);
LAB_003b0c4c:
    bVar2 = false;
  }
  else {
    this_00 = &this->tokenizer_;
    if ((this->tokenizer_).current_.type == TYPE_STRING) {
      TVar4 = TYPE_STRING;
      while (TVar4 == TYPE_STRING) {
        io::Tokenizer::Next(this_00);
        TVar4 = (this_00->current_).type;
      }
    }
    else {
      std::__cxx11::string::string((string *)&text,"[",(allocator *)&local_b0);
      bVar2 = TryConsume(this,&text);
      std::__cxx11::string::~string((string *)&text);
      if (bVar2) {
        psVar5 = &(this->tokenizer_).current_.text;
        do {
          std::__cxx11::string::string((string *)&text,"{",(allocator *)&local_60);
          _Var3 = std::operator==(psVar5,&text);
          if (_Var3) {
            std::__cxx11::string::~string((string *)&text);
LAB_003b0d03:
            bVar2 = SkipFieldMessage(this);
          }
          else {
            std::__cxx11::string::string((string *)&local_b0,"<",(allocator *)&local_80);
            _Var3 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&text);
            if (_Var3) goto LAB_003b0d03;
            bVar2 = SkipFieldValue(this);
          }
          if (bVar2 == false) break;
          std::__cxx11::string::string((string *)&text,"]",(allocator *)&local_b0);
          bVar2 = TryConsume(this,&text);
          std::__cxx11::string::~string((string *)&text);
          if (bVar2) goto LAB_003b0dc2;
          std::__cxx11::string::string((string *)&text,",",(allocator *)&local_b0);
          bVar2 = Consume(this,&text);
          std::__cxx11::string::~string((string *)&text);
        } while (bVar2);
        goto LAB_003b0c4c;
      }
      std::__cxx11::string::string((string *)&text,"-",(allocator *)&local_b0);
      bVar2 = TryConsume(this,&text);
      std::__cxx11::string::~string((string *)&text);
      TVar4 = (this_00->current_).type;
      if (1 < TVar4 - TYPE_INTEGER) {
        if (TVar4 != TYPE_IDENTIFIER) {
          std::__cxx11::string::string((string *)&text,(string *)&(this->tokenizer_).current_.text);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_b0,"Cannot skip field value, unexpected token: ",&text);
          ReportError(this,(string *)&local_b0);
LAB_003b0e9f:
          std::__cxx11::string::~string((string *)&local_b0);
          this->recursion_limit_ = this->recursion_limit_ + 1;
          psVar5 = &text;
          goto LAB_003b0c47;
        }
        if (bVar2) {
          std::__cxx11::string::string((string *)&text,(string *)&(this->tokenizer_).current_.text);
          LowerString(&text);
          bVar2 = std::operator!=(&text,"inf");
          if (((bVar2) && (bVar2 = std::operator!=(&text,"infinity"), bVar2)) &&
             (bVar2 = std::operator!=(&text,"nan"), bVar2)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b0,"Invalid float number: ",&text);
            ReportError(this,(string *)&local_b0);
            goto LAB_003b0e9f;
          }
          std::__cxx11::string::~string((string *)&text);
        }
      }
      io::Tokenizer::Next(this_00);
    }
LAB_003b0dc2:
    this->recursion_limit_ = this->recursion_limit_ + 1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SkipFieldValue() {
    if (--recursion_limit_ < 0) {
      ReportError(
          StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
        tokenizer_.Next();
      }
      ++recursion_limit_;
      return true;
    }
    if (TryConsume("[")) {
      while (true) {
        if (!LookingAt("{") && !LookingAt("<")) {
          DO(SkipFieldValue());
        } else {
          DO(SkipFieldMessage());
        }
        if (TryConsume("]")) {
          break;
        }
        DO(Consume(","));
      }
      ++recursion_limit_;
      return true;
    }
    // Possible field values other than string:
    //   12345        => TYPE_INTEGER
    //   -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //   1.2345       => TYPE_FLOAT
    //   -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //   inf          => TYPE_IDENTIFIER
    //   -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    //   TYPE_INTEGER => TYPE_IDENTIFIER
    // Divides them into two group, one with TYPE_SYMBOL
    // and the other without:
    //   Group one:
    //     12345        => TYPE_INTEGER
    //     1.2345       => TYPE_FLOAT
    //     inf          => TYPE_IDENTIFIER
    //     TYPE_INTEGER => TYPE_IDENTIFIER
    //   Group two:
    //     -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //     -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //     -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    // As we can see, the field value consists of an optional '-' and one of
    // TYPE_INTEGER, TYPE_FLOAT and TYPE_IDENTIFIER.
    bool has_minus = TryConsume("-");
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
        !LookingAtType(io::Tokenizer::TYPE_FLOAT) &&
        !LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      ReportError("Cannot skip field value, unexpected token: " + text);
      ++recursion_limit_;
      return false;
    }
    // Combination of '-' and TYPE_IDENTIFIER may result in an invalid field
    // value while other combinations all generate valid values.
    // We check if the value of this combination is valid here.
    // TYPE_IDENTIFIER after a '-' should be one of the float values listed
    // below:
    //   inf, inff, infinity, nan
    if (has_minus && LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      LowerString(&text);
      if (text != "inf" &&
          text != "infinity" && text != "nan") {
        ReportError("Invalid float number: " + text);
        ++recursion_limit_;
        return false;
      }
    }
    tokenizer_.Next();
    ++recursion_limit_;
    return true;
  }